

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalSubscriptMat4x3(ShaderEvalContext *c)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int i;
  long lVar3;
  float local_b0 [4];
  float local_a0 [4];
  float local_90 [4];
  Vector<float,_3> res_4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Vector<float,_3> res_3;
  Vector<float,_3> res_5;
  float local_24 [3];
  int aiStack_18 [6];
  
  uVar1 = *(undefined8 *)(c->coords).m_data;
  res_3.m_data[0] = (float)uVar1;
  res_3.m_data[1] = SUB84(uVar1,4);
  uVar2 = *(undefined8 *)((c->coords).m_data + 2);
  res_3.m_data[2] = (float)uVar2;
  local_24[0] = SUB84(uVar1,4);
  local_24[1] = (float)uVar2;
  local_24[2] = SUB84(uVar2,4);
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  local_90[2] = 0.0;
  lVar3 = 0;
  do {
    local_90[lVar3] = local_24[lVar3] * 0.5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_4.m_data[2] = 0.0;
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_4.m_data[lVar3] = res_3.m_data[lVar3] + local_90[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_1.m_data[0] = (float)uVar2;
  res_1.m_data[1] = SUB84(uVar2,4);
  res_1.m_data[2] = (float)uVar1;
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  local_a0[2] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3] = res_1.m_data[lVar3] * 0.25;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_2.m_data[2] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res_2.m_data[lVar3] = res_4.m_data[lVar3] + local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_5.m_data[0] = SUB84(uVar2,4);
  res_5.m_data[1] = (float)uVar1;
  res_5.m_data[2] = SUB84(uVar1,4);
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_b0[2] = 0.0;
  lVar3 = 0;
  do {
    local_b0[lVar3] = res_5.m_data[lVar3] * 0.125;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res.m_data[2] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar3 = 0;
  do {
    res.m_data[lVar3] = res_2.m_data[lVar3] + local_b0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar3]] = res_2.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

void evalSubscriptMat4x3	(ShaderEvalContext& c) { c.color.xyz()	= c.coords.swizzle(0,1,2) + 0.5f*c.coords.swizzle(1,2,3) + 0.25f*c.coords.swizzle(2,3,0) + 0.125f*c.coords.swizzle(3,0,1); }